

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

ON_Curve * __thiscall ON_NurbsSurface::IsoCurve(ON_NurbsSurface *this,int dir,double c)

{
  double *pdVar1;
  double *__src;
  uint uVar2;
  int iVar3;
  int iVar4;
  ON_NurbsCurve *local_100;
  undefined1 local_a8 [8];
  ON_NurbsCurve N;
  ON_NurbsCurve *nurbscrv;
  double *Scv;
  double *Ncv;
  int span_index;
  int Scvsize;
  int k;
  int j;
  int i;
  ON_Curve *crv;
  double c_local;
  int dir_local;
  ON_NurbsSurface *this_local;
  
  _j = (ON_NurbsCurve *)0x0;
  if (((dir == 0) || (dir == 1)) &&
     (uVar2 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])
                        (this,0), (uVar2 & 1) != 0)) {
    iVar3 = CVSize(this);
    _j = (ON_NurbsCurve *)operator_new(0x40);
    ON_NurbsCurve::ON_NurbsCurve
              (_j,this->m_dim,this->m_is_rat != 0,this->m_order[dir],this->m_cv_count[dir]);
    pdVar1 = _j->m_knot;
    __src = this->m_knot[dir];
    iVar4 = ON_NurbsCurve::KnotCount(_j);
    memcpy(pdVar1,__src,(long)iVar4 << 3);
    Ncv._4_4_ = ON_NurbsSpanIndex(this->m_order[1 - dir],this->m_cv_count[1 - dir],
                                  this->m_knot[1 - dir],c,1,0);
    if (Ncv._4_4_ < 0) {
      Ncv._4_4_ = 0;
    }
    else if (this->m_cv_count[1 - dir] - this->m_order[1 - dir] < Ncv._4_4_) {
      Ncv._4_4_ = this->m_cv_count[1 - dir] - this->m_order[1 - dir];
    }
    iVar4 = ON_NurbsCurve::CVCount(_j);
    ON_NurbsCurve::ON_NurbsCurve
              ((ON_NurbsCurve *)local_a8,iVar3 * iVar4,false,this->m_order[1 - dir],
               this->m_order[1 - dir]);
    pdVar1 = this->m_knot[1 - dir];
    iVar4 = ON_NurbsCurve::KnotCount((ON_NurbsCurve *)local_a8);
    memcpy((void *)N._32_8_,pdVar1 + Ncv._4_4_,(long)iVar4 << 3);
    for (k = 0; k < N.m_is_rat; k = k + 1) {
      Scv = ON_NurbsCurve::CV((ON_NurbsCurve *)local_a8,k);
      for (Scvsize = 0; Scvsize < this->m_cv_count[dir]; Scvsize = Scvsize + 1) {
        if (dir == 0) {
          local_100 = (ON_NurbsCurve *)CV(this,Scvsize,k + Ncv._4_4_);
        }
        else {
          local_100 = (ON_NurbsCurve *)CV(this,k + Ncv._4_4_,Scvsize);
        }
        nurbscrv = local_100;
        for (span_index = 0; span_index < iVar3; span_index = span_index + 1) {
          *Scv = (double)(nurbscrv->super_ON_Curve).super_ON_Geometry.super_ON_Object.
                         _vptr_ON_Object;
          nurbscrv = (ON_NurbsCurve *)
                     &(nurbscrv->super_ON_Curve).super_ON_Geometry.super_ON_Object.m_userdata_list;
          Scv = Scv + 1;
        }
      }
    }
    iVar3 = ON_NurbsCurve::Dimension((ON_NurbsCurve *)local_a8);
    ON_NurbsCurve::Evaluate((ON_NurbsCurve *)local_a8,c,0,iVar3,_j->m_cv,0,(int *)0x0);
    ON_NurbsCurve::~ON_NurbsCurve((ON_NurbsCurve *)local_a8);
  }
  return &_j->super_ON_Curve;
}

Assistant:

ON_Curve* ON_NurbsSurface::IsoCurve(
       int dir,          // 0 first parameter varies and second parameter is constant
                         //   e.g., point on IsoCurve(0,c) at t is srf(t,c)
                         // 1 first parameter is constant and second parameter varies
                         //   e.g., point on IsoCurve(1,c) at t is srf(c,t)
       double c          // value of constant parameter 
       ) const
{
  ON_Curve* crv = 0;
  int i,j,k,Scvsize,span_index;
  double* Ncv;
  const double* Scv;
  if ( (dir == 0 || dir == 1) && IsValid() )
  {
    Scvsize = CVSize();
    ON_NurbsCurve* nurbscrv = new ON_NurbsCurve( m_dim, m_is_rat, m_order[dir], m_cv_count[dir] );
    memcpy( nurbscrv->m_knot, m_knot[dir], nurbscrv->KnotCount()*sizeof(*nurbscrv->m_knot) );
    span_index = ON_NurbsSpanIndex(m_order[1-dir],m_cv_count[1-dir],m_knot[1-dir],c,1,0);
    if ( span_index < 0 )
      span_index = 0;
    else if ( span_index > m_cv_count[1-dir]-m_order[1-dir] )
      span_index = m_cv_count[1-dir]-m_order[1-dir];
    ON_NurbsCurve N( Scvsize*nurbscrv->CVCount(), 0, m_order[1-dir], m_order[1-dir] );
    memcpy( N.m_knot, m_knot[1-dir]+span_index, N.KnotCount()*sizeof(*N.m_knot) );
    for ( i = 0; i < N.m_cv_count; i++ ) {
      Ncv = N.CV(i);
      for ( j = 0; j < m_cv_count[dir]; j++ ) {
        Scv = (dir) ? CV(i+span_index,j) : CV(j,i+span_index);
        for ( k = 0; k < Scvsize; k++ )
          *Ncv++ = *Scv++;
      }
    }
    N.Evaluate( c, 0, N.Dimension(), nurbscrv->m_cv );
    crv = nurbscrv;
  }
  return crv;
}